

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined4 *puVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  _func_int *p_Var12;
  Mat *pMVar13;
  uint uVar14;
  Mat *pMVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  bool bVar24;
  undefined4 uVar25;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar30;
  uint uVar31;
  undefined8 in_XMM1_Qa;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Mat m;
  Option opt_pack1;
  Mat local_100;
  ulong local_b8;
  uint local_ac;
  ulong local_a8;
  Mat *local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong local_80;
  Option local_78;
  
  p_Var12 = this->_vptr_Padding_x86[-3];
  uVar14 = *(uint *)(&this->field_0xd0 + (long)p_Var12);
  if (((((uVar14 == 0) && (*(int *)(&this->field_0xd4 + (long)p_Var12) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var12) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var12) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var12) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var12) == 0)) {
    if (top_blob != bottom_blob) {
      piVar4 = bottom_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = top_blob->refcount;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar4 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar4;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar5 = bottom_blob->w;
      iVar17 = bottom_blob->h;
      iVar18 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar5;
      top_blob->h = iVar17;
      top_blob->d = iVar18;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  local_100.elempack = bottom_blob->elempack;
  local_100.elemsize = bottom_blob->elemsize;
  if (local_100.elempack == 0) {
    local_100.w = bottom_blob->w;
    local_100.h = bottom_blob->h;
    iVar5 = bottom_blob->d;
    uVar31 = bottom_blob->c;
    local_100.dims = bottom_blob->dims;
  }
  else {
    if (((int)local_100.elemsize * 8) / local_100.elempack == 8) {
      iVar5 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar5;
    }
    local_100.w = bottom_blob->w;
    local_100.h = bottom_blob->h;
    iVar5 = bottom_blob->d;
    uVar31 = bottom_blob->c;
    local_100.dims = bottom_blob->dims;
    if (local_100.elempack == 4) {
      local_a0 = bottom_blob;
      switch(local_100.dims) {
      case 1:
        uVar14 = *(uint *)(&this->field_0xd8 + (long)p_Var12) + local_100.w * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var12);
        bVar24 = (uVar14 & 3) == 0;
        local_100.dims = 1;
        if (((*(uint *)(&this->field_0xd8 + (long)p_Var12) & 3) == 0 && bVar24) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var12) == 0)) {
          Mat::create(top_blob,(int)uVar14 >> 2,(local_100.elemsize >> 2) << bVar24 * '\x02',4,
                      opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var12 = this->_vptr_Padding_x86[-3];
            iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var12);
            iVar17 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar17 = iVar5;
            }
            v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
            v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
            iVar5 = *(int *)(&this->field_0xdc + (long)p_Var12);
            iVar18 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar18 = iVar5;
            }
            v[2] = (float)(int)in_XMM1_Qa;
            v[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar17 >> 2,iVar18 >> 2,v);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        auVar33._4_4_ = local_100.h;
        auVar33._0_4_ = local_100.h;
        auVar33._8_4_ = local_100.h;
        auVar33._12_4_ = local_100.h;
        uVar11 = uVar14 + local_100.h * 4 + *(int *)(&this->field_0xd4 + (long)p_Var12);
        bVar24 = (uVar11 & 3) == 0;
        local_100.dims = 2;
        if (((uVar14 & 3) == 0 && bVar24) && (*(int *)(&this->field_0xe0 + (long)p_Var12) == 0)) {
          Mat::create(top_blob,local_100.w + *(int *)(&this->field_0xd8 + (long)p_Var12) +
                               *(int *)(&this->field_0xdc + (long)p_Var12),(int)uVar11 >> 2,
                      (local_100.elemsize >> 2) << bVar24 * '\x02',4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var12 = this->_vptr_Padding_x86[-3];
            v_02[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
            v_02[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
            iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var12);
            iVar17 = *(int *)(&this->field_0xd4 + (long)p_Var12);
            iVar18 = iVar5 + 3;
            if (-1 < iVar5) {
              iVar18 = iVar5;
            }
            iVar5 = iVar17 + 3;
            if (-1 < iVar17) {
              iVar5 = iVar17;
            }
            v_02._8_8_ = auVar33._0_8_;
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar18 >> 2,iVar5 >> 2,*(int *)(&this->field_0xd8 + (long)p_Var12),
                       *(int *)(&this->field_0xdc + (long)p_Var12),v_02);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar11 = *(uint *)(&this->field_0xe8 + (long)p_Var12) + uVar31 * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var12);
        bVar24 = (uVar11 & 3) == 0;
        local_100.dims = 3;
        if ((*(uint *)(&this->field_0xe8 + (long)p_Var12) & 3) == 0 && bVar24) {
          auVar32._4_4_ = local_100.h;
          auVar32._0_4_ = local_100.h;
          auVar32._8_4_ = local_100.h;
          auVar32._12_4_ = local_100.h;
          local_a8 = (ulong)uVar31;
          if ((uVar11 == uVar31 * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var12) == 0)) {
            uVar11 = (int)uVar11 >> 2;
            Mat::create(top_blob,local_100.w + *(int *)(&this->field_0xd8 + (long)p_Var12) +
                                 *(int *)(&this->field_0xdc + (long)p_Var12),
                        uVar14 + local_100.h + *(int *)(&this->field_0xd4 + (long)p_Var12),uVar11,
                        (local_100.elemsize >> 2) << bVar24 * '\x02',4,opt->blob_allocator);
            if (top_blob->data == (void *)0x0) {
              return -100;
            }
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar5 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              iVar17 = iVar5 + 3;
              if (-1 < iVar5) {
                iVar17 = iVar5;
              }
              if ((int)uVar11 < 1) {
                return 0;
              }
              iVar5 = -(iVar17 >> 2);
              local_98 = (ulong)uVar11;
              uVar20 = 0;
              local_b8 = CONCAT44(local_b8._4_4_,iVar5);
              uVar19 = local_a8;
              do {
                uVar23 = top_blob->elemsize;
                uVar6 = (long)top_blob->h * (long)top_blob->w;
                uVar8 = (uVar23 * uVar6 + 0xf & 0xfffffffffffffff0) / uVar23;
                if (top_blob->dims == 4) {
                  uVar8 = uVar6;
                }
                pp_Var7 = this->_vptr_Padding_x86;
                p_Var12 = pp_Var7[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var12) == 0) {
                  uVar25 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
                  auVar26._4_4_ = uVar25;
                  auVar26._0_4_ = uVar25;
                  auVar26._8_4_ = uVar25;
                  auVar26._12_4_ = uVar25;
                }
                else {
                  auVar26 = *(undefined1 (*) [16])
                             (*(long *)(&this->field_0xf8 + (long)p_Var12) + uVar20 * 0x10);
                }
                pMVar13 = (Mat *)(top_blob->cstep * uVar20 * uVar23 + (long)top_blob->data);
                uVar14 = iVar5 + (int)uVar20;
                if ((int)uVar14 < 0 || (int)uVar19 <= (int)uVar14) {
                  iVar17 = (int)uVar8 * top_blob->d;
                  if (0 < iVar17) {
                    do {
                      pMVar13->data = (void *)auVar26._0_8_;
                      pMVar13->refcount = (int *)auVar26._8_8_;
                      pMVar13 = (Mat *)&pMVar13->elemsize;
                      iVar17 = iVar17 + -1;
                    } while (iVar17 != 0);
                  }
                }
                else {
                  local_100.w = local_a0->w;
                  iVar5 = local_a0->h;
                  local_100.elemsize = local_a0->elemsize;
                  pauVar22 = (undefined1 (*) [16])
                             ((ulong)uVar14 * local_a0->cstep * local_100.elemsize +
                             (long)local_a0->data);
                  local_100.elempack = local_a0->elempack;
                  local_100.allocator = local_a0->allocator;
                  local_100.refcount = (int *)0x0;
                  local_100.c = local_a0->d;
                  local_100.d = 1;
                  local_100.dims = local_a0->dims + -1;
                  local_100.cstep =
                       (local_100.elemsize * (long)iVar5 * (long)local_100.w + 0xf &
                       0xfffffffffffffff0) / local_100.elemsize;
                  if (local_a0->dims == 4) {
                    local_100.cstep = (long)iVar5 * (long)local_100.w;
                  }
                  iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var12);
                  local_100.data = pauVar22;
                  local_100.h = iVar5;
                  if (iVar17 == 0) {
                    v_00._0_8_ = auVar26._0_8_;
                    v_00._8_8_ = auVar32._0_8_;
                    padding_constant_pack4_sse
                              ((ncnn *)&local_100,pMVar13,(Mat *)(ulong)(uint)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var12),
                               *(int *)(&this->field_0xd4 + (long)p_Var12),
                               *(int *)(&this->field_0xd8 + (long)p_Var12),
                               *(int *)(&this->field_0xdc + (long)p_Var12),v_00);
                    pp_Var7 = this->_vptr_Padding_x86;
                    p_Var12 = pp_Var7[-3];
                    iVar17 = *(int *)(&this->field_0xe0 + (long)p_Var12);
                  }
                  uVar19 = local_a8;
                  if (iVar17 == 1) {
                    iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var12);
                    iVar18 = *(int *)(&this->field_0xd4 + (long)p_Var12);
                    iVar21 = *(int *)(&this->field_0xd8 + (long)p_Var12);
                    iVar3 = *(int *)(&this->field_0xdc + (long)p_Var12);
                    pMVar15 = pMVar13;
                    if (0 < iVar17) {
                      iVar16 = 0;
                      do {
                        auVar27 = *pauVar22;
                        iVar5 = iVar21;
                        if (0 < iVar21) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        if (0 < local_100.w) {
                          iVar5 = 0;
                          pauVar10 = pauVar22;
                          do {
                            auVar27 = *pauVar10;
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pauVar10 = pauVar10 + 1;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar5 = iVar5 + 1;
                          } while (iVar5 < local_100.w);
                        }
                        iVar5 = iVar3;
                        if (0 < iVar3) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        iVar16 = iVar16 + 1;
                        iVar5 = local_100.h;
                      } while (iVar16 != iVar17);
                    }
                    if (0 < iVar5) {
                      iVar5 = 0;
                      do {
                        auVar27 = *pauVar22;
                        iVar17 = iVar21;
                        if (0 < iVar21) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + -1;
                          } while (iVar17 != 0);
                        }
                        if (0 < local_100.w) {
                          iVar17 = 0;
                          do {
                            auVar27 = *pauVar22;
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pauVar22 = pauVar22 + 1;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + 1;
                          } while (iVar17 < local_100.w);
                        }
                        iVar17 = iVar3;
                        if (0 < iVar3) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + -1;
                          } while (iVar17 != 0);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_100.h);
                    }
                    if (0 < iVar18) {
                      iVar5 = 0;
                      do {
                        auVar27 = pauVar22[-(long)local_100.w];
                        iVar17 = iVar21;
                        if (0 < iVar21) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + -1;
                          } while (iVar17 != 0);
                        }
                        if (0 < local_100.w) {
                          iVar17 = 0;
                          pauVar10 = pauVar22 + -(long)local_100.w;
                          do {
                            auVar27 = *pauVar10;
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pauVar10 = pauVar10 + 1;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + 1;
                          } while (iVar17 < local_100.w);
                        }
                        iVar17 = iVar3;
                        if (0 < iVar3) {
                          do {
                            pMVar15->data = (void *)auVar27._0_8_;
                            pMVar15->refcount = (int *)auVar27._8_8_;
                            pMVar15 = (Mat *)&pMVar15->elemsize;
                            iVar17 = iVar17 + -1;
                          } while (iVar17 != 0);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 != iVar18);
                    }
                  }
                  p_Var12 = pp_Var7[-3];
                  if (*(int *)(&this->field_0xe0 + (long)p_Var12) == 2) {
                    iVar5 = *(int *)(&this->field_0xd0 + (long)p_Var12);
                    iVar17 = *(int *)(&this->field_0xd4 + (long)p_Var12);
                    uVar14 = *(uint *)(&this->field_0xd8 + (long)p_Var12);
                    uVar23 = (ulong)uVar14;
                    uVar31 = *(uint *)(&this->field_0xdc + (long)p_Var12);
                    uVar8 = (ulong)uVar31;
                    pauVar22 = (undefined1 (*) [16])
                               ((undefined1 *)local_100.data + (long)(iVar5 * local_100.w * 4) * 4);
                    if (0 < iVar5) {
                      iVar18 = 0;
                      do {
                        lVar9 = uVar23 << 4;
                        if (0 < (int)uVar14) {
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar22 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar9 != 0);
                        }
                        pauVar10 = pauVar22;
                        if (0 < local_100.w) {
                          iVar21 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar13 = *pauVar10;
                            pauVar10 = pauVar10 + 1;
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            iVar21 = iVar21 + 1;
                          } while (iVar21 < local_100.w);
                        }
                        if (0 < (int)uVar31) {
                          lVar9 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar10 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar1 = uVar8 * 0x10 + lVar9;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        pauVar22 = (undefined1 (*) [16])
                                   ((long)pauVar22 + (long)(local_100.w * 4) * -4);
                        iVar18 = iVar18 + 1;
                      } while (iVar18 != iVar5);
                    }
                    if (0 < local_100.h) {
                      iVar5 = 0;
                      do {
                        lVar9 = uVar23 << 4;
                        if (0 < (int)uVar14) {
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar22 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar9 != 0);
                        }
                        if (0 < local_100.w) {
                          iVar18 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar13 = *pauVar22;
                            pauVar22 = pauVar22 + 1;
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            iVar18 = iVar18 + 1;
                          } while (iVar18 < local_100.w);
                        }
                        if (0 < (int)uVar31) {
                          lVar9 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar22 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar1 = uVar8 * 0x10 + lVar9;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar1 != -0x10);
                        }
                        iVar5 = iVar5 + 1;
                      } while (iVar5 < local_100.h);
                    }
                    if (0 < iVar17) {
                      uVar6 = (ulong)local_100.w;
                      pauVar22 = pauVar22 + uVar6 * -2;
                      iVar5 = 0;
                      do {
                        lVar9 = uVar23 << 4;
                        if (0 < (int)uVar14) {
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar22 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar9 != 0);
                          uVar6 = (ulong)(uint)local_100.w;
                        }
                        pauVar10 = pauVar22;
                        if (0 < (int)uVar6) {
                          iVar18 = 0;
                          do {
                            *(undefined1 (*) [16])pMVar13 = *pauVar10;
                            pauVar10 = pauVar10 + 1;
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            iVar18 = iVar18 + 1;
                            uVar6 = (ulong)(uint)local_100.w;
                          } while (iVar18 < local_100.w);
                        }
                        if (0 < (int)uVar31) {
                          lVar9 = -0x20;
                          do {
                            *(undefined1 (*) [16])pMVar13 =
                                 *(undefined1 (*) [16])(*pauVar10 + lVar9);
                            pMVar13 = (Mat *)&pMVar13->elemsize;
                            lVar1 = uVar8 * 0x10 + lVar9;
                            lVar9 = lVar9 + -0x10;
                          } while (lVar1 != -0x10);
                          uVar6 = (ulong)(uint)local_100.w;
                        }
                        pauVar22 = (undefined1 (*) [16])
                                   ((long)pauVar22 + (long)((int)uVar6 * 4) * -4);
                        iVar5 = iVar5 + 1;
                      } while (iVar5 != iVar17);
                    }
                  }
                  iVar5 = (int)local_b8;
                  if (local_100.refcount != (int *)0x0) {
                    LOCK();
                    *local_100.refcount = *local_100.refcount + -1;
                    UNLOCK();
                    if (*local_100.refcount == 0) {
                      if (local_100.allocator == (Allocator *)0x0) {
                        if ((undefined1 (*) [16])local_100.data != (undefined1 (*) [16])0x0) {
                          free(local_100.data);
                          iVar5 = (int)local_b8;
                        }
                      }
                      else {
                        (*(local_100.allocator)->_vptr_Allocator[3])();
                        iVar5 = (int)local_b8;
                      }
                    }
                  }
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != local_98);
              return 0;
            }
            return -100;
          }
        }
        break;
      case 4:
        local_100.dims = 4;
        if (*(int *)(&this->field_0xe0 + (long)p_Var12) == 0) {
          local_ac = *(int *)(&this->field_0xe8 + (long)p_Var12) + iVar5 +
                     *(int *)(&this->field_0xec + (long)p_Var12);
          auVar27._4_4_ = local_100.h;
          auVar27._0_4_ = local_100.h;
          auVar27._8_4_ = local_100.h;
          auVar27._12_4_ = local_100.h;
          Mat::create(top_blob,local_100.w + *(int *)(&this->field_0xd8 + (long)p_Var12) +
                               *(int *)(&this->field_0xdc + (long)p_Var12),
                      uVar14 + local_100.h + *(int *)(&this->field_0xd4 + (long)p_Var12),local_ac,
                      uVar31,local_100.elemsize,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)uVar31 < 1) {
              return 0;
            }
            local_80 = (ulong)uVar31;
            uVar19 = (ulong)local_ac;
            uVar20 = 0;
            local_b8 = uVar19;
            do {
              p_Var12 = this->_vptr_Padding_x86[-3];
              if (*(int *)(&this->field_0xf0 + (long)p_Var12) == 0) {
                uVar25 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var12);
                uVar28 = uVar25;
                uVar29 = uVar25;
                uVar30 = uVar25;
              }
              else {
                puVar2 = (undefined4 *)
                         (*(long *)(&this->field_0xf8 + (long)p_Var12) + uVar20 * 0x10);
                uVar25 = *puVar2;
                uVar28 = puVar2[1];
                uVar29 = puVar2[2];
                uVar30 = puVar2[3];
              }
              if (0 < (int)local_ac) {
                uVar23 = 0;
                local_98 = CONCAT44(uVar28,uVar25);
                local_a8 = uVar20;
                uStack_90 = uVar29;
                uStack_8c = uVar30;
                do {
                  uVar8 = (long)top_blob->h * (long)top_blob->w;
                  pMVar13 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar23 * uVar8 +
                                   top_blob->cstep * uVar20 * top_blob->elemsize);
                  p_Var12 = this->_vptr_Padding_x86[-3];
                  uVar14 = (int)uVar23 - *(int *)(&this->field_0xe8 + (long)p_Var12);
                  if ((int)uVar14 < 0 || iVar5 <= (int)uVar14) {
                    if (0 < (int)uVar8) {
                      do {
                        *(undefined4 *)&pMVar13->data = uVar25;
                        *(undefined4 *)((long)&pMVar13->data + 4) = uVar28;
                        *(undefined4 *)&pMVar13->refcount = uVar29;
                        *(undefined4 *)((long)&pMVar13->refcount + 4) = uVar30;
                        pMVar13 = (Mat *)&pMVar13->elemsize;
                        uVar14 = (int)uVar8 - 1;
                        uVar8 = (ulong)uVar14;
                      } while (uVar14 != 0);
                    }
                  }
                  else {
                    local_100.w = local_a0->w;
                    local_100.elemsize = local_a0->elemsize;
                    local_100.h = local_a0->h;
                    local_100.elempack = local_a0->elempack;
                    local_100.allocator = local_a0->allocator;
                    local_100.cstep = (long)local_100.h * (long)local_100.w;
                    local_100.data =
                         (void *)((long)local_a0->data +
                                 local_100.cstep * local_100.elemsize * (ulong)uVar14 +
                                 local_a0->cstep * uVar20 * local_100.elemsize);
                    local_100.refcount = (int *)0x0;
                    local_100.dims = 2;
                    local_100.d = 1;
                    local_100.c = 1;
                    v_01._8_8_ = auVar27._0_8_;
                    v_01[0] = (float)(undefined4)local_98;
                    v_01[1] = (float)local_98._4_4_;
                    padding_constant_pack4_sse
                              ((ncnn *)&local_100,pMVar13,(Mat *)(long)top_blob->w,
                               *(int *)(&this->field_0xd0 + (long)p_Var12),
                               *(int *)(&this->field_0xd4 + (long)p_Var12),
                               *(int *)(&this->field_0xd8 + (long)p_Var12),
                               *(int *)(&this->field_0xdc + (long)p_Var12),v_01);
                    uVar19 = local_b8;
                    uVar20 = local_a8;
                    uVar25 = (undefined4)local_98;
                    uVar28 = local_98._4_4_;
                    uVar29 = uStack_90;
                    uVar30 = uStack_8c;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar19);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != local_80);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.allocator = bottom_blob->allocator;
  local_100.c = uVar31;
  local_100.d = iVar5;
  local_100.cstep = bottom_blob->cstep;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
  }
  if (local_100.elempack != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    local_78.use_bf16_storage = opt->use_bf16_storage;
    local_78.use_fp16_packed = opt->use_fp16_packed;
    local_78.use_fp16_storage = opt->use_fp16_storage;
    local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_78.use_int8_packed = opt->use_int8_packed;
    local_78.use_int8_storage = opt->use_int8_storage;
    local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_78.use_packing_layout = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_0 = opt->use_reserved_0;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_100,1,&local_78);
  }
  iVar5 = Padding::forward((Padding *)
                           ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                           &local_100,top_blob,opt);
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        if (local_100.data != (void *)0x0) {
          free(local_100.data);
        }
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}